

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void spell_power_word_kill(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  undefined4 in_R8D;
  undefined4 unaff_retaddr;
  int modify;
  int saves;
  int dam;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_000037a8;
  CHAR_DATA *in_stack_000037b0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int size;
  int number;
  uint in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  CHAR_DATA *pCVar2;
  
  number = 0;
  pCVar2 = in_RCX;
  act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
      (void *)((ulong)in_stack_ffffffffffffffd4 << 0x20),
      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
      (void *)CONCAT44(in_stack_ffffffffffffffd4,number),
      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
  for (size = 0; size < 5; size = size + 1) {
    bVar1 = saves_spell((int)victim,_saves,modify);
    if (bVar1) {
      number = number + 1;
    }
  }
  bVar1 = is_immortal((CHAR_DATA *)CONCAT44(size,in_stack_ffffffffffffffc8));
  if ((bVar1) && (in_RCX->level < *(short *)(in_RDX + 0x138))) {
    number = 0;
  }
  if (number == 0) {
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
        (void *)((ulong)in_stack_ffffffffffffffd4 << 0x20),
        (void *)CONCAT44(size,in_stack_ffffffffffffffc8),0);
    send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
        (void *)CONCAT44(in_stack_ffffffffffffffd4,number),
        (void *)CONCAT44(size,in_stack_ffffffffffffffc8),0);
    raw_kill(in_stack_000037b0,in_stack_000037a8);
  }
  else {
    dice(number,size);
    damage_old((CHAR_DATA *)CONCAT44(modify,unaff_retaddr),(CHAR_DATA *)CONCAT44(in_EDI,in_ESI),
               (int)((ulong)in_RDX >> 0x20),(int)in_RDX,(int)((ulong)pCVar2 >> 0x20),
               SUB81((ulong)pCVar2 >> 0x18,0));
  }
  return;
}

Assistant:

void spell_power_word_kill(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam, saves, modify;

	saves = 0;

	act("$n points a finger at $N and utters the word, 'Die'.", ch, nullptr, victim, TO_NOTVICT);
	act("$n points a finger at you and utters the word, 'Die'.", ch, nullptr, victim, TO_VICT);
	send_to_char("You intone a word of unholy power.\n\r", ch);

	for (modify = 0; modify < 5; modify++)
	{
		if (saves_spell(level - 1, victim, DAM_NEGATIVE))
			saves++;
	}

	if (is_immortal(ch) && (victim->level < ch->level))
	{
		saves = 0;
	}

	if (saves == 0)
	{
		act("$N shudders in shock as $S heart explodes!", ch, nullptr, victim, TO_NOTVICT);
		send_to_char("You feel your heart rupture in a violent explosion of pain!\n\r", victim);
		act("Your word of power vaporizes $N's heart, killing $M instantly!", ch, nullptr, victim, TO_CHAR);
		raw_kill(ch, victim);
		return;
	}

	dam = dice(level, 14);
	dam /= saves;

	damage_old(ch, victim, dam, sn, DAM_NEGATIVE, true);
}